

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_module * ly_ctx_get_module_latest_by(ly_ctx *ctx,char *key,size_t key_offset)

{
  uint uVar1;
  lyd_node **pplVar2;
  lys_module *plVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = (ctx->list).count;
  uVar5 = 0;
  do {
    if (uVar1 <= uVar5) {
      return (lys_module *)0x0;
    }
    uVar6 = (ulong)uVar5;
    pplVar2 = (ctx->list).field_2.dnodes;
    while( true ) {
      plVar3 = (lys_module *)pplVar2[uVar6];
      iVar4 = strcmp(key,*(char **)((long)&plVar3->ctx + key_offset));
      if (iVar4 == 0) break;
      uVar6 = uVar6 + 1;
      if (uVar1 == uVar6) {
        return (lys_module *)0x0;
      }
    }
    uVar5 = (int)uVar6 + 1;
    if ((plVar3->latest_revision & 1) != 0) {
      return plVar3;
    }
  } while( true );
}

Assistant:

static struct lys_module *
ly_ctx_get_module_latest_by(const struct ly_ctx *ctx, const char *key, size_t key_offset)
{
    struct lys_module *mod;
    uint32_t index = 0;

    while ((mod = ly_ctx_get_module_by_iter(ctx, key, 0, key_offset, &index))) {
        if (mod->latest_revision & LYS_MOD_LATEST_REV) {
            return mod;
        }
    }

    return NULL;
}